

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5MergeChunkCallback(Fts5Index *p,void *pCtx,u8 *pChunk,int nChunk)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  i64 dummy;
  u64 local_38;
  
  if (p->rc == 0) {
    do {
      iVar2 = *(int *)((long)pCtx + 0x28) + *(int *)((long)pCtx + 0x18);
      iVar5 = p->pConfig->pgsz;
      if (iVar2 + nChunk < iVar5) break;
      iVar5 = iVar5 - iVar2;
      uVar4 = 0;
      if (0 < iVar5) {
        do {
          bVar1 = sqlite3Fts5GetVarint(pChunk + uVar4,&local_38);
          uVar3 = (int)uVar4 + (uint)bVar1;
          uVar4 = (ulong)uVar3;
        } while ((int)uVar3 < iVar5);
      }
      sqlite3Fts5BufferAppendBlob(&p->rc,(Fts5Buffer *)((long)pCtx + 0x10),(u32)uVar4,pChunk);
      pChunk = pChunk + uVar4;
      nChunk = nChunk - (u32)uVar4;
      fts5WriteFlushLeaf(p,(Fts5SegWriter *)pCtx);
    } while (p->rc == 0);
  }
  if (0 < nChunk) {
    sqlite3Fts5BufferAppendBlob(&p->rc,(Fts5Buffer *)((long)pCtx + 0x10),nChunk,pChunk);
    return;
  }
  return;
}

Assistant:

static void fts5MergeChunkCallback(
  Fts5Index *p, 
  void *pCtx, 
  const u8 *pChunk, int nChunk
){
  Fts5SegWriter *pWriter = (Fts5SegWriter*)pCtx;
  fts5WriteAppendPoslistData(p, pWriter, pChunk, nChunk);
}